

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
::emplace_new_key<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
          (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<slang::parsing::TokenKind,_slang::parsing::Token> *key)

{
  TokenKind TVar1;
  Info *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 *puVar6;
  TokenKind TVar7;
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
  sVar8;
  EntryPointer psVar10;
  EntryPointer psVar11;
  char __tmp_4;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
  pVar14;
  Token __tmp;
  pair<slang::parsing::TokenKind,_slang::parsing::Token> local_28;
  char cVar9;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
       )distance_from_desired)) {
    puVar6 = (undefined8 *)(*(long *)(this + 0x20) + 1);
    auVar12._8_4_ = (int)((ulong)puVar6 >> 0x20);
    auVar12._0_8_ = puVar6;
    auVar12._12_4_ = 0x45300000;
    lVar5 = *(long *)(this + 0x10) + 1;
    auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar13._0_8_ = lVar5;
    auVar13._12_4_ = 0x45300000;
    if ((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)puVar6) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) {
      cVar9 = current_entry->distance_from_desired;
      if (cVar9 < '\0') {
        *(Info **)((long)&current_entry->field_1 + 0x10) = (key->second).info;
        uVar3 = *(undefined8 *)&key->second;
        *(undefined8 *)&current_entry->field_1 = *(undefined8 *)key;
        *(undefined8 *)((long)&current_entry->field_1 + 8) = uVar3;
        current_entry->distance_from_desired = distance_from_desired;
LAB_002ab183:
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        pVar14._9_7_ = (int7)((ulong)puVar6 >> 8);
        pVar14.second = true;
        pVar14.first.current = current_entry;
        return pVar14;
      }
      pIVar2 = (key->second).info;
      uVar3 = *(undefined8 *)key;
      uVar4 = *(undefined8 *)&key->second;
      current_entry->distance_from_desired = distance_from_desired;
      local_28.first = (TokenKind)uVar3;
      TVar7 = (current_entry->field_1).value.first;
      (current_entry->field_1).value.first = local_28.first;
      puVar6 = (undefined8 *)((long)&current_entry->field_1 + 8);
      local_28.second._0_8_ = *(undefined8 *)((long)&current_entry->field_1 + 8);
      local_28.second.info = *(Info **)((long)&current_entry->field_1 + 0x10);
      *(undefined8 *)((long)&current_entry->field_1 + 8) = uVar4;
      *(Info **)((long)&current_entry->field_1 + 0x10) = pIVar2;
      psVar10 = current_entry;
      do {
        sVar8 = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
                 )(cVar9 + '\x01');
        psVar11 = psVar10;
        while( true ) {
          psVar10 = psVar11 + 1;
          cVar9 = psVar10->distance_from_desired;
          local_28._2_6_ = SUB86((ulong)uVar3 >> 0x10,0);
          if (cVar9 < '\0') {
            local_28.first = TVar7;
            *(Info **)((long)&psVar11[1].field_1 + 0x10) = local_28.second.info;
            *(undefined8 *)&psVar11[1].field_1 = local_28._0_8_;
            *(undefined8 *)((long)&psVar11[1].field_1 + 8) = local_28.second._0_8_;
            psVar10->distance_from_desired = (int8_t)sVar8;
            goto LAB_002ab183;
          }
          if (cVar9 < (char)sVar8) break;
          sVar8 = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
                   )((char)sVar8 + '\x01');
          psVar11 = psVar10;
          if (this[0x19] == sVar8) {
            key = &local_28;
            local_28.first = (current_entry->field_1).value.first;
            (current_entry->field_1).value.first = TVar7;
            uVar3 = *puVar6;
            pIVar2 = *(Info **)((long)&current_entry->field_1 + 0x10);
            *puVar6 = local_28.second._0_8_;
            *(Info **)((long)&current_entry->field_1 + 0x10) = local_28.second.info;
            local_28.second._0_8_ = uVar3;
            local_28.second.info = pIVar2;
            goto LAB_002ab1b0;
          }
        }
        psVar10->distance_from_desired = (int8_t)sVar8;
        TVar1 = psVar11[1].field_1.value.first;
        psVar11[1].field_1.value.first = TVar7;
        uVar4 = *(undefined8 *)((long)&psVar11[1].field_1 + 8);
        pIVar2 = *(Info **)((long)&psVar11[1].field_1 + 0x10);
        *(undefined8 *)((long)&psVar11[1].field_1 + 8) = local_28.second._0_8_;
        *(Info **)((long)&psVar11[1].field_1 + 0x10) = local_28.second.info;
        TVar7 = TVar1;
        local_28.second._0_8_ = uVar4;
        local_28.second.info = pIVar2;
      } while( true );
    }
  }
LAB_002ab1b0:
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
  ::grow((sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
          *)this);
  pVar14 = emplace<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>(this,key);
  return pVar14;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }